

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableVector.h
# Opt level: O0

GeometryData * __thiscall
Rml::StableVector<Rml::RenderManager::GeometryData>::erase
          (GeometryData *__return_storage_ptr__,StableVector<Rml::RenderManager::GeometryData> *this
          ,StableVectorIndex index)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference __obj;
  byte local_85;
  GeometryData local_78;
  reference local_40;
  reference local_30;
  StableVectorIndex local_1c;
  StableVector<Rml::RenderManager::GeometryData> *pSStack_18;
  StableVectorIndex index_local;
  StableVector<Rml::RenderManager::GeometryData> *this_local;
  
  local_1c = index;
  pSStack_18 = this;
  this_local = (StableVector<Rml::RenderManager::GeometryData> *)__return_storage_ptr__;
  sVar3 = ::std::
          vector<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
          ::size(&this->elements);
  local_85 = 0;
  if (index < sVar3) {
    local_30 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->free_slots,(ulong)local_1c);
    bVar2 = ::std::_Bit_reference::operator_cast_to_bool(&local_30);
    local_85 = bVar2 ^ 0xff;
  }
  if ((((local_85 ^ 0xff) & 1) != 0) &&
     (bVar2 = Assert("RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)])",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/StableVector.h"
                     ,0x5d), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_40 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->free_slots,(ulong)local_1c);
  ::std::_Bit_reference::operator=(&local_40,true);
  __obj = ::std::
          vector<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
          ::operator[](&this->elements,(ulong)local_1c);
  local_78.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.handle = 0;
  RenderManager::GeometryData::GeometryData(&local_78);
  ::std::exchange<Rml::RenderManager::GeometryData,Rml::RenderManager::GeometryData>
            (__return_storage_ptr__,__obj,&local_78);
  RenderManager::GeometryData::~GeometryData(&local_78);
  return __return_storage_ptr__;
}

Assistant:

T erase(StableVectorIndex index)
	{
		RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)]);
		free_slots[size_t(index)] = true;
		return std::exchange(elements[size_t(index)], T());
	}